

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# egluCallLogWrapper.cpp
# Opt level: O2

ostream * __thiscall eglu::operator<<(eglu *this,ostream *str,PointerFmt<void_*> fmt)

{
  ostream *poVar1;
  ulong uVar2;
  
  if (str != (ostream *)0x0) {
    std::operator<<((ostream *)this,"{ ");
    for (uVar2 = 0; (uint)fmt.arr != uVar2; uVar2 = uVar2 + 1) {
      if (uVar2 != 0) {
        std::operator<<((ostream *)this,", ");
      }
      std::ostream::_M_insert<void_const*>(this);
    }
    std::operator<<((ostream *)this," }");
    return (ostream *)this;
  }
  poVar1 = std::operator<<((ostream *)this,"(null)");
  return poVar1;
}

Assistant:

std::ostream& operator<< (std::ostream& str, PointerFmt<T> fmt)
{
	if (fmt.arr != DE_NULL)
	{
		str << "{ ";
		for (deUint32 ndx = 0; ndx < fmt.size; ndx++)
		{
			if (ndx != 0)
				str << ", ";
			str << fmt.arr[ndx];
		}
		str << " }";
		return str;
	}
	else
		return str << "(null)";
}